

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdiff.c
# Opt level: O2

void split(int64_t *I,int64_t *V,int64_t start,int64_t len,int64_t h)

{
  long lVar1;
  int64_t *piVar2;
  long *plVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int64_t iVar13;
  long lVar14;
  
  do {
    if (len < 0x10) {
      lVar7 = len + start;
      for (; start < lVar7; start = start + lVar6) {
        plVar3 = I + start;
        lVar6 = 1;
        iVar13 = V[h + *plVar3];
        lVar10 = start;
        while (lVar10 = lVar10 + 1, lVar10 < lVar7) {
          lVar8 = V[h + I[lVar10]];
          lVar9 = iVar13;
          if (lVar8 < iVar13) {
            lVar9 = lVar8;
            lVar6 = 0;
          }
          bVar5 = lVar8 <= iVar13;
          iVar13 = lVar9;
          if (bVar5) {
            lVar8 = plVar3[lVar6];
            plVar3[lVar6] = I[lVar10];
            I[lVar10] = lVar8;
            lVar6 = lVar6 + 1;
          }
        }
        lVar10 = 0;
        if (0 < lVar6) {
          lVar10 = lVar6;
        }
        for (lVar8 = 0; lVar10 != lVar8; lVar8 = lVar8 + 1) {
          V[plVar3[lVar8]] = start + lVar6 + -1;
        }
        if (lVar6 == 1) {
          *plVar3 = -1;
        }
      }
      return;
    }
    lVar7 = V[h + *(long *)((long)I + start * 8 + (len & 0xfffffffffffffffeU) * 4)];
    lVar8 = len + start;
    lVar6 = 0;
    lVar9 = 0;
    for (lVar10 = start; lVar10 < lVar8; lVar10 = lVar10 + 1) {
      lVar6 = lVar6 + (ulong)(V[h + I[lVar10]] < lVar7);
      lVar9 = lVar9 + (ulong)(V[h + I[lVar10]] == lVar7);
    }
    lVar10 = lVar6 + start;
    lVar1 = lVar10 + lVar9;
    piVar2 = I + lVar10;
    lVar11 = 0;
    lVar12 = 0;
    lVar14 = start;
    while (lVar14 < lVar10) {
      lVar4 = I[lVar14];
      if (V[h + lVar4] < lVar7) {
        lVar14 = lVar14 + 1;
      }
      else if (V[h + lVar4] == lVar7) {
        I[lVar14] = piVar2[lVar11];
        piVar2[lVar11] = lVar4;
        lVar11 = lVar11 + 1;
      }
      else {
        I[lVar14] = I[lVar1 + lVar12];
        I[lVar1 + lVar12] = lVar4;
        lVar12 = lVar12 + 1;
      }
    }
    while (lVar11 < lVar9) {
      lVar14 = piVar2[lVar11];
      if (V[h + lVar14] == lVar7) {
        lVar11 = lVar11 + 1;
      }
      else {
        piVar2[lVar11] = I[lVar1 + lVar12];
        I[lVar1 + lVar12] = lVar14;
        lVar12 = lVar12 + 1;
      }
    }
    if (lVar6 != 0) {
      split(I,V,start,lVar6,h);
    }
    for (lVar7 = 0; lVar9 != lVar7; lVar7 = lVar7 + 1) {
      V[piVar2[lVar7]] = lVar1 + -1;
    }
    if (lVar10 == lVar1 + -1) {
      *piVar2 = -1;
    }
    len = lVar8 - lVar1;
    start = lVar1;
  } while (len != 0 && lVar1 <= lVar8);
  return;
}

Assistant:

static void split(int64_t *I,int64_t *V,int64_t start,int64_t len,int64_t h)
{
	int64_t i,j,k,x,tmp,jj,kk;

	if(len<16) {
		for(k=start;k<start+len;k+=j) {
			j=1;x=V[I[k]+h];
			for(i=1;k+i<start+len;i++) {
				if(V[I[k+i]+h]<x) {
					x=V[I[k+i]+h];
					j=0;
				};
				if(V[I[k+i]+h]==x) {
					tmp=I[k+j];I[k+j]=I[k+i];I[k+i]=tmp;
					j++;
				};
			};
			for(i=0;i<j;i++) V[I[k+i]]=k+j-1;
			if(j==1) I[k]=-1;
		};
		return;
	};

	x=V[I[start+len/2]+h];
	jj=0;kk=0;
	for(i=start;i<start+len;i++) {
		if(V[I[i]+h]<x) jj++;
		if(V[I[i]+h]==x) kk++;
	};
	jj+=start;kk+=jj;

	i=start;j=0;k=0;
	while(i<jj) {
		if(V[I[i]+h]<x) {
			i++;
		} else if(V[I[i]+h]==x) {
			tmp=I[i];I[i]=I[jj+j];I[jj+j]=tmp;
			j++;
		} else {
			tmp=I[i];I[i]=I[kk+k];I[kk+k]=tmp;
			k++;
		};
	};

	while(jj+j<kk) {
		if(V[I[jj+j]+h]==x) {
			j++;
		} else {
			tmp=I[jj+j];I[jj+j]=I[kk+k];I[kk+k]=tmp;
			k++;
		};
	};

	if(jj>start) split(I,V,start,jj-start,h);

	for(i=0;i<kk-jj;i++) V[I[jj+i]]=kk-1;
	if(jj==kk-1) I[jj]=-1;

	if(start+len>kk) split(I,V,kk,start+len-kk,h);
}